

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int allocateBtreePage(BtShared *pBt,MemPage **ppPage,Pgno *pPgno,Pgno nearby,u8 eMode)

{
  u8 uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  Pgno pgno;
  MemPage *pMVar6;
  Bitvec *p;
  bool bVar7;
  bool bVar8;
  MemPage *pMVar9;
  MemPage *pMVar10;
  int iVar11;
  uint uVar12;
  byte *pbVar13;
  u8 *puVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  int iVar23;
  bool bVar24;
  int unaff_R13D;
  MemPage *pMVar25;
  long in_FS_OFFSET;
  u8 eType;
  MemPage *pTrunk;
  int local_ac;
  MemPage *local_48;
  MemPage *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = (MemPage *)0x0;
  pMVar6 = pBt->pPage1;
  uVar15 = pBt->nPage;
  uVar22 = *(uint *)(pMVar6->aData + 0x24);
  uVar22 = uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 | uVar22 << 0x18;
  if (uVar15 <= uVar22) {
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12db7,
                "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
    unaff_R13D = 0xb;
    goto LAB_00141789;
  }
  if (uVar22 == 0) {
    uVar1 = pBt->bDoTruncate;
    iVar11 = sqlite3PagerWrite(pMVar6->pDbPage);
    if (iVar11 == 0) {
      uVar15 = pBt->nPage;
      pBt->nPage = uVar15 + 1;
      uVar22 = (uint)sqlite3PendingByte / pBt->pageSize;
      if (uVar15 == uVar22) {
        pBt->nPage = uVar15 + 2;
      }
      uVar15 = (uint)(uVar1 == '\0');
      if (pBt->autoVacuum == '\0') {
LAB_00141690:
        uVar22 = pBt->nPage;
        *(uint *)(pBt->pPage1->aData + 0x1c) =
             uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 | uVar22 << 0x18;
        pgno = pBt->nPage;
        *pPgno = pgno;
        iVar11 = btreeGetUnusedPage(pBt,pgno,ppPage,uVar15);
        if (iVar11 != 0) goto LAB_001416c0;
        iVar11 = sqlite3PagerWrite((*ppPage)->pDbPage);
        bVar24 = true;
        if (iVar11 != 0) {
          if (*ppPage != (MemPage *)0x0) {
            sqlite3PagerUnrefNotNull((*ppPage)->pDbPage);
          }
          *ppPage = (MemPage *)0x0;
        }
      }
      else {
        uVar16 = pBt->nPage;
        uVar17 = 0;
        if (1 < uVar16) {
          iVar11 = (uVar16 - 2) - (uVar16 - 2) % (pBt->usableSize / 5 + 1);
          uVar17 = iVar11 + (uint)(iVar11 + 1U == uVar22) + 2;
        }
        if (uVar17 != uVar16) goto LAB_00141690;
        local_48 = (MemPage *)0x0;
        iVar11 = btreeGetUnusedPage(pBt,uVar16,&local_48,uVar15);
        pMVar6 = local_48;
        if ((iVar11 == 0) &&
           (iVar11 = sqlite3PagerWrite(local_48->pDbPage), pMVar6 != (MemPage *)0x0)) {
          sqlite3PagerUnrefNotNull(pMVar6->pDbPage);
        }
        unaff_R13D = iVar11;
        if (iVar11 == 0) {
          uVar22 = pBt->nPage;
          pBt->nPage = uVar22 + 1;
          if (uVar22 == (uint)sqlite3PendingByte / pBt->pageSize) {
            pBt->nPage = uVar22 + 2;
          }
          goto LAB_00141690;
        }
        bVar24 = false;
      }
    }
    else {
LAB_001416c0:
      bVar24 = false;
      unaff_R13D = iVar11;
    }
    if (!bVar24) goto LAB_00141789;
    pMVar25 = (MemPage *)0x0;
  }
  else {
    if (eMode == '\x02') {
      bVar24 = true;
LAB_00140ffb:
      iVar11 = sqlite3PagerWrite(pMVar6->pDbPage);
      if (iVar11 != 0) goto LAB_00141013;
      uVar16 = uVar22 - 1;
      *(uint *)(pMVar6->aData + 0x24) =
           uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 * 0x1000000;
      uVar16 = 0;
      do {
        pMVar25 = local_40;
        if (local_40 == (MemPage *)0x0) {
          puVar14 = pMVar6->aData;
          uVar17 = (uint)puVar14[0x22] << 8 |
                   (uint)puVar14[0x21] << 0x10 | (uint)puVar14[0x20] << 0x18;
          pbVar13 = puVar14 + 0x23;
        }
        else {
          pbVar13 = local_40->aData;
          uVar17 = (uint)pbVar13[2] << 8 | (uint)pbVar13[1] << 0x10 | (uint)*pbVar13 << 0x18;
          pbVar13 = pbVar13 + 3;
        }
        uVar17 = *pbVar13 | uVar17;
        uVar21 = uVar16;
        if ((uVar15 < uVar17) || (uVar21 = uVar16 + 1, uVar22 < uVar16)) {
          iVar11 = 0xb;
          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12def,
                      "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
          uVar16 = uVar21;
        }
        else {
          iVar11 = btreeGetUnusedPage(pBt,uVar17,&local_40,0);
          uVar16 = uVar21;
        }
        pMVar10 = local_40;
        if (iVar11 != 0) {
          local_40 = (MemPage *)0x0;
          goto LAB_00141686;
        }
        puVar14 = local_40->aData;
        uVar21 = *(uint *)(puVar14 + 4);
        uVar21 = uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 | uVar21 << 0x18
        ;
        if ((bVar24) || (uVar21 != 0)) {
          if ((pBt->usableSize >> 2) - 2 < uVar21) {
            iVar11 = 0xb;
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12e0c,
                        "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
            goto LAB_0014175a;
          }
          if (bVar24) {
            if ((uVar17 != nearby) && (eMode != '\x02' || nearby <= uVar17)) goto LAB_0014119f;
            *pPgno = uVar17;
            *ppPage = local_40;
            iVar11 = sqlite3PagerWrite(local_40->pDbPage);
            bVar24 = false;
            if (iVar11 != 0) goto LAB_0014175a;
            if (uVar21 == 0) {
              if (pMVar25 == (MemPage *)0x0) {
                puVar14 = pMVar6->aData + 0x20;
              }
              else {
                iVar11 = sqlite3PagerWrite(pMVar25->pDbPage);
                if (iVar11 != 0) goto LAB_0014175f;
                puVar14 = pMVar25->aData;
              }
              *(undefined4 *)puVar14 = *(undefined4 *)pMVar10->aData;
              iVar11 = 0;
            }
            else {
              local_48 = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
              puVar14 = pMVar10->aData;
              bVar2 = puVar14[8];
              bVar3 = puVar14[9];
              bVar4 = puVar14[10];
              bVar5 = puVar14[0xb];
              uVar17 = (uint)bVar4 << 8 | (uint)bVar3 << 0x10 | (uint)bVar2 << 0x18 | (uint)bVar5;
              if (uVar15 < uVar17) {
                iVar11 = 0xb;
                sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12e2e,
                            "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
LAB_00141371:
                bVar8 = false;
              }
              else {
                iVar11 = btreeGetUnusedPage(pBt,uVar17,&local_48,0);
                pMVar9 = local_48;
                if (iVar11 != 0) goto LAB_00141371;
                iVar11 = sqlite3PagerWrite(local_48->pDbPage);
                if (iVar11 != 0) {
                  if (pMVar9 != (MemPage *)0x0) {
                    sqlite3PagerUnrefNotNull(pMVar9->pDbPage);
                  }
                  goto LAB_00141371;
                }
                *(undefined4 *)pMVar9->aData = *(undefined4 *)pMVar10->aData;
                uVar17 = uVar21 - 1;
                *(uint *)(pMVar9->aData + 4) =
                     uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 |
                     uVar17 * 0x1000000;
                memcpy(pMVar9->aData + 8,pMVar10->aData + 0xc,(ulong)(uVar21 * 4 - 4));
                if (pMVar9 != (MemPage *)0x0) {
                  sqlite3PagerUnrefNotNull(pMVar9->pDbPage);
                }
                if (pMVar25 == (MemPage *)0x0) {
                  puVar14 = pMVar6->aData;
                  puVar14[0x20] = bVar2;
                  puVar14[0x21] = bVar3;
                  puVar14[0x22] = bVar4;
                  puVar14[0x23] = bVar5;
                  bVar8 = true;
                  iVar11 = 0;
                }
                else {
                  iVar19 = sqlite3PagerWrite(pMVar25->pDbPage);
                  iVar11 = 0;
                  if (iVar19 == 0) {
                    pbVar13 = pMVar25->aData;
                    *pbVar13 = bVar2;
                    pbVar13[1] = bVar3;
                    pbVar13[2] = bVar4;
                    pbVar13[3] = bVar5;
                    bVar8 = true;
                  }
                  else {
                    bVar8 = false;
                    iVar11 = iVar19;
                  }
                }
              }
              bVar24 = false;
              if (!bVar8) goto LAB_0014175f;
            }
            local_40 = (MemPage *)0x0;
            bVar7 = false;
          }
          else {
LAB_0014119f:
            if (uVar21 == 0) goto LAB_001411ee;
            uVar17 = 0;
            if (nearby != 0) {
              if (eMode == '\x02') {
                uVar18 = 8;
                uVar20 = 0;
                do {
                  uVar12 = *(uint *)(puVar14 + uVar18);
                  if ((uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                      uVar12 << 0x18) <= nearby) {
                    uVar17 = (uint)uVar20;
                    break;
                  }
                  uVar20 = uVar20 + 1;
                  uVar18 = uVar18 + 4;
                } while (uVar21 != uVar20);
              }
              else {
                uVar17 = 0;
                if (uVar21 != 1) {
                  uVar17 = *(uint *)(puVar14 + 8);
                  iVar19 = (uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 |
                           uVar17 << 0x18) - nearby;
                  iVar11 = -iVar19;
                  if (-1 < iVar19) {
                    iVar11 = iVar19;
                  }
                  uVar17 = 0;
                  uVar20 = 1;
                  uVar18 = 0xc;
                  do {
                    uVar12 = *(uint *)(puVar14 + uVar18);
                    iVar23 = (uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                             uVar12 << 0x18) - nearby;
                    iVar19 = -iVar23;
                    if (-1 < iVar23) {
                      iVar19 = iVar23;
                    }
                    if (iVar19 < iVar11) {
                      uVar17 = (uint)uVar20;
                      iVar11 = iVar19;
                    }
                    uVar20 = uVar20 + 1;
                    uVar18 = uVar18 + 4;
                  } while (uVar21 != uVar20);
                }
              }
            }
            uVar18 = uVar17 * 4 + 8;
            uVar12 = *(uint *)(puVar14 + uVar18);
            uVar12 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                     uVar12 << 0x18;
            if (uVar15 < uVar12 || uVar12 < 2) {
              bVar8 = false;
              iVar11 = 0xb;
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12e6f,
                          "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
            }
            else if (((uVar12 == nearby) || (eMode == '\x02' && uVar12 < nearby)) || (!bVar24)) {
              *pPgno = uVar12;
              iVar11 = sqlite3PagerWrite(local_40->pDbPage);
              if (iVar11 == 0) {
                uVar12 = uVar21 - 1;
                if (uVar17 < uVar12) {
                  *(undefined4 *)(puVar14 + uVar18) = *(undefined4 *)(puVar14 + (uVar21 * 4 + 4));
                }
                *(uint *)(puVar14 + 4) =
                     uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                     uVar12 * 0x1000000;
                uVar17 = *pPgno;
                p = pBt->pHasContent;
                if (p == (Bitvec *)0x0) {
                  uVar21 = 1;
                }
                else {
                  uVar21 = 0;
                  if (uVar17 <= p->iSize) {
                    iVar11 = sqlite3BitvecTestNotNull(p,uVar17);
                    uVar21 = (uint)(iVar11 == 0);
                  }
                }
                iVar11 = btreeGetUnusedPage(pBt,uVar17,ppPage,uVar21);
                bVar8 = true;
                if (iVar11 == 0) {
                  iVar11 = sqlite3PagerWrite((*ppPage)->pDbPage);
                  if (iVar11 == 0) {
                    bVar24 = false;
                    goto LAB_001413ff;
                  }
                  if (*ppPage != (MemPage *)0x0) {
                    sqlite3PagerUnrefNotNull((*ppPage)->pDbPage);
                  }
                  *ppPage = (MemPage *)0x0;
                }
                bVar24 = false;
              }
              else {
                bVar8 = false;
              }
            }
            else {
              bVar24 = true;
LAB_001413ff:
              bVar8 = true;
              iVar11 = 0;
            }
            bVar7 = bVar24;
            if (!bVar8) goto LAB_00141686;
          }
        }
        else {
          iVar11 = sqlite3PagerWrite(local_40->pDbPage);
          if (iVar11 != 0) {
LAB_0014175a:
            bVar24 = false;
            goto LAB_0014175f;
          }
          *pPgno = uVar17;
          *(undefined4 *)(pMVar6->aData + 0x20) = *(undefined4 *)pMVar10->aData;
          *ppPage = pMVar10;
          local_40 = (MemPage *)0x0;
          bVar24 = false;
LAB_001411ee:
          iVar11 = 0;
          bVar7 = bVar24;
        }
        if (pMVar25 != (MemPage *)0x0) {
          sqlite3PagerUnrefNotNull(pMVar25->pDbPage);
        }
        bVar24 = true;
      } while (bVar7);
      pMVar25 = (MemPage *)0x0;
LAB_00141686:
      bVar24 = false;
    }
    else {
      if ((eMode != '\x01') || (uVar15 < nearby)) {
        bVar24 = false;
        goto LAB_00140ffb;
      }
      local_48 = (MemPage *)CONCAT71(local_48._1_7_,0xaa);
      iVar11 = ptrmapGet(pBt,nearby,(u8 *)&local_48,(Pgno *)0x0);
      if (iVar11 == 0) {
        bVar24 = iVar11 == 0 && (char)local_48 == '\x02';
        local_ac = iVar11;
        goto LAB_00140ffb;
      }
LAB_00141013:
      pMVar25 = (MemPage *)0x0;
      bVar24 = true;
      local_ac = iVar11;
    }
LAB_0014175f:
    unaff_R13D = local_ac;
    if (bVar24) goto LAB_00141789;
  }
  if (local_40 != (MemPage *)0x0) {
    sqlite3PagerUnrefNotNull(local_40->pDbPage);
  }
  unaff_R13D = iVar11;
  if (pMVar25 != (MemPage *)0x0) {
    sqlite3PagerUnrefNotNull(pMVar25->pDbPage);
  }
LAB_00141789:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return unaff_R13D;
}

Assistant:

static int allocateBtreePage(
  BtShared *pBt,         /* The btree */
  MemPage **ppPage,      /* Store pointer to the allocated page here */
  Pgno *pPgno,           /* Store the page number here */
  Pgno nearby,           /* Search for a page near this one */
  u8 eMode               /* BTALLOC_EXACT, BTALLOC_LT, or BTALLOC_ANY */
){
  MemPage *pPage1;
  int rc;
  u32 n;     /* Number of pages on the freelist */
  u32 k;     /* Number of leaves on the trunk of the freelist */
  MemPage *pTrunk = 0;
  MemPage *pPrevTrunk = 0;
  Pgno mxPage;     /* Total size of the database file */

  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( eMode==BTALLOC_ANY || (nearby>0 && IfNotOmitAV(pBt->autoVacuum)) );
  pPage1 = pBt->pPage1;
  mxPage = btreePagecount(pBt);
  /* EVIDENCE-OF: R-21003-45125 The 4-byte big-endian integer at offset 36
  ** stores the total number of pages on the freelist. */
  n = get4byte(&pPage1->aData[36]);
  testcase( n==mxPage-1 );
  if( n>=mxPage ){
    return SQLITE_CORRUPT_BKPT;
  }
  if( n>0 ){
    /* There are pages on the freelist.  Reuse one of those pages. */
    Pgno iTrunk;
    u8 searchList = 0; /* If the free-list must be searched for 'nearby' */
    u32 nSearch = 0;   /* Count of the number of search attempts */

    /* If eMode==BTALLOC_EXACT and a query of the pointer-map
    ** shows that the page 'nearby' is somewhere on the free-list, then
    ** the entire-list will be searched for that page.
    */
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( eMode==BTALLOC_EXACT ){
      if( nearby<=mxPage ){
        u8 eType;
        assert( nearby>0 );
        assert( pBt->autoVacuum );
        rc = ptrmapGet(pBt, nearby, &eType, 0);
        if( rc ) return rc;
        if( eType==PTRMAP_FREEPAGE ){
          searchList = 1;
        }
      }
    }else if( eMode==BTALLOC_LE ){
      searchList = 1;
    }
#endif

    /* Decrement the free-list count by 1. Set iTrunk to the index of the
    ** first free-list trunk page. iPrevTrunk is initially 1.
    */
    rc = sqlite3PagerWrite(pPage1->pDbPage);
    if( rc ) return rc;
    put4byte(&pPage1->aData[36], n-1);

    /* The code within this loop is run only once if the 'searchList' variable
    ** is not true. Otherwise, it runs once for each trunk-page on the
    ** free-list until the page 'nearby' is located (eMode==BTALLOC_EXACT)
    ** or until a page less than 'nearby' is located (eMode==BTALLOC_LT)
    */
    do {
      pPrevTrunk = pTrunk;
      if( pPrevTrunk ){
        /* EVIDENCE-OF: R-01506-11053 The first integer on a freelist trunk page
        ** is the page number of the next freelist trunk page in the list or
        ** zero if this is the last freelist trunk page. */
        iTrunk = get4byte(&pPrevTrunk->aData[0]);
      }else{
        /* EVIDENCE-OF: R-59841-13798 The 4-byte big-endian integer at offset 32
        ** stores the page number of the first page of the freelist, or zero if
        ** the freelist is empty. */
        iTrunk = get4byte(&pPage1->aData[32]);
      }
      testcase( iTrunk==mxPage );
      if( iTrunk>mxPage || nSearch++ > n ){
        rc = SQLITE_CORRUPT_PGNO(pPrevTrunk ? pPrevTrunk->pgno : 1);
      }else{
        rc = btreeGetUnusedPage(pBt, iTrunk, &pTrunk, 0);
      }
      if( rc ){
        pTrunk = 0;
        goto end_allocate_page;
      }
      assert( pTrunk!=0 );
      assert( pTrunk->aData!=0 );
      /* EVIDENCE-OF: R-13523-04394 The second integer on a freelist trunk page
      ** is the number of leaf page pointers to follow. */
      k = get4byte(&pTrunk->aData[4]);
      if( k==0 && !searchList ){
        /* The trunk has no leaves and the list is not being searched.
        ** So extract the trunk page itself and use it as the newly
        ** allocated page */
        assert( pPrevTrunk==0 );
        rc = sqlite3PagerWrite(pTrunk->pDbPage);
        if( rc ){
          goto end_allocate_page;
        }
        *pPgno = iTrunk;
        memcpy(&pPage1->aData[32], &pTrunk->aData[0], 4);
        *ppPage = pTrunk;
        pTrunk = 0;
        TRACE(("ALLOCATE: %u trunk - %u free pages left\n", *pPgno, n-1));
      }else if( k>(u32)(pBt->usableSize/4 - 2) ){
        /* Value of k is out of range.  Database corruption */
        rc = SQLITE_CORRUPT_PGNO(iTrunk);
        goto end_allocate_page;
#ifndef SQLITE_OMIT_AUTOVACUUM
      }else if( searchList
            && (nearby==iTrunk || (iTrunk<nearby && eMode==BTALLOC_LE))
      ){
        /* The list is being searched and this trunk page is the page
        ** to allocate, regardless of whether it has leaves.
        */
        *pPgno = iTrunk;
        *ppPage = pTrunk;
        searchList = 0;
        rc = sqlite3PagerWrite(pTrunk->pDbPage);
        if( rc ){
          goto end_allocate_page;
        }
        if( k==0 ){
          if( !pPrevTrunk ){
            memcpy(&pPage1->aData[32], &pTrunk->aData[0], 4);
          }else{
            rc = sqlite3PagerWrite(pPrevTrunk->pDbPage);
            if( rc!=SQLITE_OK ){
              goto end_allocate_page;
            }
            memcpy(&pPrevTrunk->aData[0], &pTrunk->aData[0], 4);
          }
        }else{
          /* The trunk page is required by the caller but it contains
          ** pointers to free-list leaves. The first leaf becomes a trunk
          ** page in this case.
          */
          MemPage *pNewTrunk;
          Pgno iNewTrunk = get4byte(&pTrunk->aData[8]);
          if( iNewTrunk>mxPage ){
            rc = SQLITE_CORRUPT_PGNO(iTrunk);
            goto end_allocate_page;
          }
          testcase( iNewTrunk==mxPage );
          rc = btreeGetUnusedPage(pBt, iNewTrunk, &pNewTrunk, 0);
          if( rc!=SQLITE_OK ){
            goto end_allocate_page;
          }
          rc = sqlite3PagerWrite(pNewTrunk->pDbPage);
          if( rc!=SQLITE_OK ){
            releasePage(pNewTrunk);
            goto end_allocate_page;
          }
          memcpy(&pNewTrunk->aData[0], &pTrunk->aData[0], 4);
          put4byte(&pNewTrunk->aData[4], k-1);
          memcpy(&pNewTrunk->aData[8], &pTrunk->aData[12], (k-1)*4);
          releasePage(pNewTrunk);
          if( !pPrevTrunk ){
            assert( sqlite3PagerIswriteable(pPage1->pDbPage) );
            put4byte(&pPage1->aData[32], iNewTrunk);
          }else{
            rc = sqlite3PagerWrite(pPrevTrunk->pDbPage);
            if( rc ){
              goto end_allocate_page;
            }
            put4byte(&pPrevTrunk->aData[0], iNewTrunk);
          }
        }
        pTrunk = 0;
        TRACE(("ALLOCATE: %u trunk - %u free pages left\n", *pPgno, n-1));
#endif
      }else if( k>0 ){
        /* Extract a leaf from the trunk */
        u32 closest;
        Pgno iPage;
        unsigned char *aData = pTrunk->aData;
        if( nearby>0 ){
          u32 i;
          closest = 0;
          if( eMode==BTALLOC_LE ){
            for(i=0; i<k; i++){
              iPage = get4byte(&aData[8+i*4]);
              if( iPage<=nearby ){
                closest = i;
                break;
              }
            }
          }else{
            int dist;
            dist = sqlite3AbsInt32(get4byte(&aData[8]) - nearby);
            for(i=1; i<k; i++){
              int d2 = sqlite3AbsInt32(get4byte(&aData[8+i*4]) - nearby);
              if( d2<dist ){
                closest = i;
                dist = d2;
              }
            }
          }
        }else{
          closest = 0;
        }

        iPage = get4byte(&aData[8+closest*4]);
        testcase( iPage==mxPage );
        if( iPage>mxPage || iPage<2 ){
          rc = SQLITE_CORRUPT_PGNO(iTrunk);
          goto end_allocate_page;
        }
        testcase( iPage==mxPage );
        if( !searchList
         || (iPage==nearby || (iPage<nearby && eMode==BTALLOC_LE))
        ){
          int noContent;
          *pPgno = iPage;
          TRACE(("ALLOCATE: %u was leaf %u of %u on trunk %u"
                 ": %u more free pages\n",
                 *pPgno, closest+1, k, pTrunk->pgno, n-1));
          rc = sqlite3PagerWrite(pTrunk->pDbPage);
          if( rc ) goto end_allocate_page;
          if( closest<k-1 ){
            memcpy(&aData[8+closest*4], &aData[4+k*4], 4);
          }
          put4byte(&aData[4], k-1);
          noContent = !btreeGetHasContent(pBt, *pPgno)? PAGER_GET_NOCONTENT : 0;
          rc = btreeGetUnusedPage(pBt, *pPgno, ppPage, noContent);
          if( rc==SQLITE_OK ){
            rc = sqlite3PagerWrite((*ppPage)->pDbPage);
            if( rc!=SQLITE_OK ){
              releasePage(*ppPage);
              *ppPage = 0;
            }
          }
          searchList = 0;
        }
      }
      releasePage(pPrevTrunk);
      pPrevTrunk = 0;
    }while( searchList );
  }else{
    /* There are no pages on the freelist, so append a new page to the
    ** database image.
    **
    ** Normally, new pages allocated by this block can be requested from the
    ** pager layer with the 'no-content' flag set. This prevents the pager
    ** from trying to read the pages content from disk. However, if the
    ** current transaction has already run one or more incremental-vacuum
    ** steps, then the page we are about to allocate may contain content
    ** that is required in the event of a rollback. In this case, do
    ** not set the no-content flag. This causes the pager to load and journal
    ** the current page content before overwriting it.
    **
    ** Note that the pager will not actually attempt to load or journal
    ** content for any page that really does lie past the end of the database
    ** file on disk. So the effects of disabling the no-content optimization
    ** here are confined to those pages that lie between the end of the
    ** database image and the end of the database file.
    */
    int bNoContent = (0==IfNotOmitAV(pBt->bDoTruncate))? PAGER_GET_NOCONTENT:0;

    rc = sqlite3PagerWrite(pBt->pPage1->pDbPage);
    if( rc ) return rc;
    pBt->nPage++;
    if( pBt->nPage==PENDING_BYTE_PAGE(pBt) ) pBt->nPage++;

#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum && PTRMAP_ISPAGE(pBt, pBt->nPage) ){
      /* If *pPgno refers to a pointer-map page, allocate two new pages
      ** at the end of the file instead of one. The first allocated page
      ** becomes a new pointer-map page, the second is used by the caller.
      */
      MemPage *pPg = 0;
      TRACE(("ALLOCATE: %u from end of file (pointer-map page)\n", pBt->nPage));
      assert( pBt->nPage!=PENDING_BYTE_PAGE(pBt) );
      rc = btreeGetUnusedPage(pBt, pBt->nPage, &pPg, bNoContent);
      if( rc==SQLITE_OK ){
        rc = sqlite3PagerWrite(pPg->pDbPage);
        releasePage(pPg);
      }
      if( rc ) return rc;
      pBt->nPage++;
      if( pBt->nPage==PENDING_BYTE_PAGE(pBt) ){ pBt->nPage++; }
    }
#endif
    put4byte(28 + (u8*)pBt->pPage1->aData, pBt->nPage);
    *pPgno = pBt->nPage;

    assert( *pPgno!=PENDING_BYTE_PAGE(pBt) );
    rc = btreeGetUnusedPage(pBt, *pPgno, ppPage, bNoContent);
    if( rc ) return rc;
    rc = sqlite3PagerWrite((*ppPage)->pDbPage);
    if( rc!=SQLITE_OK ){
      releasePage(*ppPage);
      *ppPage = 0;
    }
    TRACE(("ALLOCATE: %u from end of file\n", *pPgno));
  }

  assert( CORRUPT_DB || *pPgno!=PENDING_BYTE_PAGE(pBt) );

end_allocate_page:
  releasePage(pTrunk);
  releasePage(pPrevTrunk);
  assert( rc!=SQLITE_OK || sqlite3PagerPageRefcount((*ppPage)->pDbPage)<=1 );
  assert( rc!=SQLITE_OK || (*ppPage)->isInit==0 );
  return rc;
}